

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

CompilationUnitSymbol * __thiscall slang::ast::Scope::getCompilationUnit(Scope *this)

{
  CompilationUnitSymbol *pCVar1;
  
  while( true ) {
    if (this == (Scope *)0x0) {
      return (CompilationUnitSymbol *)0x0;
    }
    pCVar1 = (CompilationUnitSymbol *)this->thisSym;
    if ((pCVar1->super_Symbol).kind == CompilationUnit) break;
    this = (pCVar1->super_Symbol).parentScope;
  }
  return pCVar1;
}

Assistant:

const CompilationUnitSymbol* Scope::getCompilationUnit() const {
    auto currScope = this;
    while (currScope && currScope->asSymbol().kind != SymbolKind::CompilationUnit)
        currScope = currScope->asSymbol().getParentScope();

    if (currScope)
        return &currScope->asSymbol().as<CompilationUnitSymbol>();

    return nullptr;
}